

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

void Abc_AigCheckFaninOrder(Abc_Aig_t *pMan)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  long lVar3;
  Abc_Obj_t **ppAVar4;
  
  for (lVar3 = 0; lVar3 < pMan->nBins; lVar3 = lVar3 + 1) {
    ppAVar4 = pMan->pBins + lVar3;
    while (pObj = *ppAVar4, pObj != (Abc_Obj_t *)0x0) {
      pAVar2 = Abc_ObjChild0(pObj);
      iVar1 = *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x10);
      pAVar2 = Abc_ObjChild1(pObj);
      if (*(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x10) < iVar1) {
        printf("Node %d has incorrect ordering of fanins.\n",(ulong)(uint)pObj->Id);
      }
      ppAVar4 = &pObj->pNext;
    }
  }
  return;
}

Assistant:

void Abc_AigCheckFaninOrder( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pEnt;
    int i;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pEnt )
        {
            if ( Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id > Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id )
            {
//                int i0 = Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id;
//                int i1 = Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id;
                printf( "Node %d has incorrect ordering of fanins.\n", pEnt->Id );
            }
        }
}